

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScalableKReach.cpp
# Opt level: O2

bool __thiscall ScalableKReach::bfs(ScalableKReach *this,vertex_t s,vertex_t t)

{
  size_t *psVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  value_type vVar2;
  byte bVar3;
  byte bVar4;
  uint v;
  uint uVar5;
  size_type sVar6;
  uint *puVar7;
  bool bVar8;
  reference pvVar9;
  reference pvVar10;
  byte *pbVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar12;
  uint *nxt;
  uint *puVar13;
  size_t i;
  ulong __n;
  
  psVar1 = &this->back_;
  this_00 = &this->distance_;
  this->back_ = 0;
  this->front_ = 0;
  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(this_00,(ulong)s);
  *pvVar9 = '\0';
  this_01 = &this->queue_;
  sVar6 = this->back_;
  this->back_ = sVar6 + 1;
  pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,sVar6);
  *pvVar10 = s;
  while (this->back_ != this->front_) {
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(this_00,(ulong)t);
    if (*pvVar9 != '?') break;
    sVar6 = this->front_;
    this->front_ = sVar6 + 1;
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,sVar6);
    v = *pvVar10;
    pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(this_00,(ulong)v);
    if (*pbVar11 < this->k_) {
      pvVar12 = Graph::successors(this->graph_,v);
      puVar7 = (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar13 = (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start; puVar13 != puVar7;
          puVar13 = puVar13 + 1) {
        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           (this_00,(ulong)*puVar13);
        if (*pvVar9 == '?') {
          bVar8 = PartialIndex::indexed(&this->D1_,*puVar13);
          if (!bVar8) {
            bVar8 = PartialIndex::indexed(&this->D2_,*puVar13);
            if (!bVar8) {
              pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 (this_00,(ulong)v);
              vVar2 = *pvVar9;
              pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                 (this_00,(ulong)*puVar13);
              *pvVar9 = vVar2 + '\x01';
              uVar5 = *puVar13;
              sVar6 = *psVar1;
              *psVar1 = sVar6 + 1;
              pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,sVar6);
              *pvVar10 = uVar5;
            }
          }
        }
      }
    }
  }
  pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(this_00,(ulong)t);
  bVar3 = *pbVar11;
  bVar4 = this->k_;
  for (__n = 0; __n < *psVar1; __n = __n + 1) {
    pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_01,__n);
    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(this_00,(ulong)*pvVar10)
    ;
    *pvVar9 = '?';
  }
  return bVar3 <= bVar4;
}

Assistant:

bool ScalableKReach::bfs(vertex_t s, vertex_t t) const {
    back_ = 0;
    front_ = 0;
    distance_.at(s) = 0;
    queue_.at(back_++) = s;
    while (back_ != front_ && distance_.at(t) == INF8) {
        vertex_t cur = queue_.at(front_++);
        if (distance_.at(cur) >= k_) {
            continue;
        }
        for (const auto &nxt : graph_.successors(cur)) {
            if (distance_.at(nxt) == INF8 && !D1_.indexed(nxt) && !D2_.indexed(nxt)) {
                distance_.at(nxt) = distance_.at(cur) + 1;
                queue_.at(back_++) = nxt;
            }
        }
    }
    bool result = distance_.at(t) <= k_;
    for (size_t i = 0; i < back_; ++i) {
        distance_.at(queue_.at(i)) = INF8;
    }
    return result;
}